

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterObject::runTestCase
          (TestCharReaderFailIfExtraTestcommentAfterObject *this)

{
  undefined1 uVar1;
  uint uVar2;
  long in_RDI;
  bool ok;
  string errs;
  CharReader *reader;
  char doc [47];
  Value root;
  CharReaderBuilder b;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  Value *in_stack_fffffffffffffe40;
  uint line;
  CharReaderBuilder *this_00;
  char *in_stack_fffffffffffffe48;
  CharReaderBuilder *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  string *expected;
  TestResult *in_stack_fffffffffffffe60;
  TestResult *result;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  Value *in_stack_fffffffffffffeb8;
  Value *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  Value *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  TestResult *in_stack_fffffffffffffef0;
  string local_f8 [32];
  CharReaderBuilder *local_d8;
  char local_a8 [39];
  undefined8 uStack_81;
  undefined1 local_60 [96];
  
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffffe50);
  Json::Value::Value((Value *)in_stack_fffffffffffffe50,
                     (ValueType)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  builtin_strncpy(local_a8 + 0x1f,"ling\n//c",8);
  uStack_81 = (PredicateContext *)0xa746e656d6d6f;
  local_a8[0x10] = 'v';
  local_a8[0x11] = 'a';
  local_a8[0x12] = 'l';
  local_a8[0x13] = 'u';
  local_a8[0x14] = 'e';
  local_a8[0x15] = '\"';
  local_a8[0x16] = ' ';
  local_a8[0x17] = '}';
  local_a8._24_7_ = 0x696172742f2f20;
  local_a8[0] = '{';
  local_a8[1] = ' ';
  local_a8[2] = '\"';
  local_a8[3] = 'p';
  local_a8[4] = 'r';
  local_a8[5] = 'o';
  local_a8[6] = 'p';
  local_a8[7] = 'e';
  local_a8[8] = 'r';
  local_a8[9] = 't';
  local_a8[10] = 'y';
  local_a8[0xb] = '\"';
  local_a8[0xc] = ' ';
  local_a8[0xd] = ':';
  local_a8[0xe] = ' ';
  local_a8[0xf] = '\"';
  Json::Value::Value(in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f);
  Json::Value::operator[]((Value *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Json::Value::operator=
            (in_stack_fffffffffffffe40,
             (Value *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  line = (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  local_d8 = (CharReaderBuilder *)
             Json::CharReaderBuilder::newCharReader
                       ((CharReaderBuilder *)
                        CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::string::string(local_f8);
  uVar2 = (*(local_d8->super_Factory)._vptr_Factory[2])
                    (local_d8,local_a8,(long)&uStack_81 + 7,local_60,local_f8);
  uVar1 = (undefined1)uVar2;
  if ((uVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20),in_stack_fffffffffffffe48);
  }
  expected = *(string **)(in_RDI + 8);
  result = (TestResult *)&stack0xfffffffffffffedf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,"",(allocator *)result);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffeb8,local_f8);
  JsonTest::checkStringEqual
            (result,expected,(string *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,line,
             (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
  Json::Value::operator[]((Value *)in_stack_fffffffffffffe50,*(char **)(in_RDI + 8));
  Json::Value::Value(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  JsonTest::checkEqual<char_const*,Json::Value>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
  Json::Value::~Value((Value *)CONCAT17(uVar1,in_stack_fffffffffffffe70));
  this_00 = local_d8;
  if (local_d8 != (CharReaderBuilder *)0x0) {
    (*(local_d8->super_Factory)._vptr_Factory[1])();
  }
  std::__cxx11::string::~string(local_f8);
  Json::Value::~Value((Value *)CONCAT17(uVar1,in_stack_fffffffffffffe70));
  Json::CharReaderBuilder::~CharReaderBuilder(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterObject) {
  Json::CharReaderBuilder b;
  Json::Value root;
  {
  char const doc[] =
      "{ \"property\" : \"value\" } //trailing\n//comment\n";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
}